

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O0

undefined8 __thiscall
cfd::AddressFactory::GetAddressByLockingScript(AddressFactory *this,Script *locking_script)

{
  ByteData BVar1;
  byte bVar2;
  ScriptType SVar3;
  ScriptOperator *pSVar4;
  undefined8 uVar5;
  undefined8 in_RDI;
  uint8_t var;
  ByteData160 hash_1;
  ByteData160 hash;
  Pubkey pubkey;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 uVar6;
  WitnessVersion in_stack_fffffffffffffdfc;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe00;
  AddressType in_stack_fffffffffffffe04;
  AddressFactory *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  allocator *paVar8;
  CfdError in_stack_fffffffffffffe1c;
  CfdException *in_stack_fffffffffffffe20;
  allocator local_1a1;
  string local_1a0 [38];
  undefined1 local_17a;
  allocator local_179;
  string local_178 [63];
  char local_139;
  vector local_f0 [24];
  ByteData160 local_d8 [48];
  vector local_a8 [24];
  ByteData160 local_90 [28];
  undefined4 local_74;
  Pubkey local_58;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_30 [2];
  
  cfd::core::Script::GetElementList();
  bVar2 = cfd::core::Script::IsP2pkScript();
  if ((bVar2 & 1) == 0) {
    bVar2 = cfd::core::Script::IsP2pkhScript();
    if ((bVar2 & 1) == 0) {
      bVar2 = cfd::core::Script::IsP2shScript();
      if ((bVar2 & 1) == 0) {
        bVar2 = cfd::core::Script::IsP2wpkhScript();
        if (((bVar2 & 1) == 0) && (bVar2 = cfd::core::Script::IsP2wshScript(), (bVar2 & 1) == 0)) {
          bVar2 = cfd::core::Script::IsTaprootScript();
          if ((bVar2 & 1) == 0) {
            bVar2 = cfd::core::Script::IsWitnessProgram();
            if ((bVar2 & 1) != 0) {
              std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
              operator[](local_30,0);
              pSVar4 = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
              bVar2 = cfd::core::ScriptOperator::operator!=
                                (pSVar4,(ScriptOperator *)&core::ScriptOperator::OP_0);
              if ((bVar2 & 1) != 0) {
                std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                operator[](local_30,0);
                pSVar4 = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
                SVar3 = core::ScriptOperator::GetDataType(pSVar4);
                local_139 = (char)SVar3 + -0x51;
                std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                operator[](local_30,1);
                cfd::core::ScriptElement::GetBinaryData();
                GetSegwitAddressByHash
                          (in_stack_fffffffffffffe08,
                           (ByteData *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)
                           ,in_stack_fffffffffffffdfc);
                core::ByteData::~ByteData((ByteData *)0x3cfa43);
                local_74 = 1;
                goto LAB_003cfc3c;
              }
            }
            bVar2 = cfd::core::Script::IsMultisigScript();
            if ((bVar2 & 1) != 0) {
              local_17a = 1;
              uVar5 = __cxa_allocate_exception(0x30);
              paVar8 = &local_179;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_178,"script type is multisig script.",paVar8);
              core::CfdException::CfdException
                        (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,(string *)paVar8);
              local_17a = 0;
              __cxa_throw(uVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            uVar5 = __cxa_allocate_exception(0x30);
            uVar6 = (undefined4)uVar5;
            uVar7 = (undefined4)((ulong)uVar5 >> 0x20);
            paVar8 = &local_1a1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1a0,"unknown type locking script.",paVar8);
            core::CfdException::CfdException
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10
                      );
            __cxa_throw(CONCAT44(uVar7,uVar6),&core::CfdException::typeinfo,
                        core::CfdException::~CfdException);
          }
          std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
          operator[](local_30,1);
          cfd::core::ScriptElement::GetBinaryData();
          GetSegwitAddressByHash
                    (in_stack_fffffffffffffe08,
                     (ByteData *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdfc);
          core::ByteData::~ByteData((ByteData *)0x3cf918);
          local_74 = 1;
        }
        else {
          std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
          operator[](local_30,1);
          cfd::core::ScriptElement::GetBinaryData();
          GetSegwitAddressByHash
                    (in_stack_fffffffffffffe08,
                     (ByteData *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          core::ByteData::~ByteData((ByteData *)0x3cf873);
          local_74 = 1;
        }
      }
      else {
        std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator[]
                  (local_30,1);
        cfd::core::ScriptElement::GetBinaryData();
        cfd::core::ByteData::GetBytes();
        cfd::core::ByteData160::ByteData160(local_d8,local_f0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe10);
        core::ByteData::~ByteData((ByteData *)0x3cf742);
        GetAddressByHash(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                         (ByteData160 *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        local_74 = 1;
        core::ByteData160::~ByteData160((ByteData160 *)0x3cf778);
      }
    }
    else {
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator[]
                (local_30,2);
      cfd::core::ScriptElement::GetBinaryData();
      cfd::core::ByteData::GetBytes();
      cfd::core::ByteData160::ByteData160(local_90,local_a8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe10)
      ;
      core::ByteData::~ByteData((ByteData *)0x3cf60c);
      GetAddressByHash(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                       (ByteData160 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8))
      ;
      local_74 = 1;
      core::ByteData160::~ByteData160((ByteData160 *)0x3cf642);
    }
  }
  else {
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator[]
              (local_30,0);
    cfd::core::ScriptElement::GetBinaryData();
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffdfc;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffffdf8;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffffe00;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffffe04;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe08;
    cfd::core::Pubkey::Pubkey(&local_58,BVar1);
    core::ByteData::~ByteData((ByteData *)0x3cf4e5);
    CreateP2pkhAddress(in_stack_fffffffffffffe08,
                       (Pubkey *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    local_74 = 1;
    core::Pubkey::~Pubkey((Pubkey *)0x3cf516);
  }
LAB_003cfc3c:
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             in_stack_fffffffffffffe10);
  return in_RDI;
}

Assistant:

Address AddressFactory::GetAddressByLockingScript(
    const Script& locking_script) const {
  std::vector<ScriptElement> items = locking_script.GetElementList();
  if (locking_script.IsP2pkScript()) {
    Pubkey pubkey = Pubkey(items[0].GetBinaryData());
    return CreateP2pkhAddress(pubkey);
  } else if (locking_script.IsP2pkhScript()) {
    ByteData160 hash = ByteData160(items[2].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2pkhAddress, hash);
  } else if (locking_script.IsP2shScript()) {
    ByteData160 hash = ByteData160(items[1].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2shAddress, hash);
  } else if (
      locking_script.IsP2wpkhScript() || locking_script.IsP2wshScript()) {
    return GetSegwitAddressByHash(items[1].GetBinaryData());
  } else if (locking_script.IsTaprootScript()) {
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), WitnessVersion::kVersion1);
  } else if (
      locking_script.IsWitnessProgram() &&
      (items[0].GetOpCode() != ScriptOperator::OP_0)) {
    uint8_t var = items[0].GetOpCode().GetDataType() - ScriptType::kOp_1;
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), static_cast<WitnessVersion>(var + 1));
  } else if (locking_script.IsMultisigScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "script type is multisig script.");
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "unknown type locking script.");
  }
}